

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::UniformInfoQueryCase::test
          (UniformInfoQueryCase *this,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,
          vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,ShaderProgram *program,Random *rnd)

{
  deUint32 programGL_00;
  TestLog *log_00;
  MessageBuilder *pMVar1;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  ScopedLogSection local_458;
  ScopedLogSection section_2;
  undefined1 local_448 [7];
  bool success_2;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  ScopedLogSection local_278;
  ScopedLogSection section_1;
  undefined1 local_268 [7];
  bool success_1;
  undefined4 local_e8;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_a9;
  string local_a8;
  ScopedLogSection local_88;
  ScopedLogSection section;
  undefined1 local_78 [7];
  bool success;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  basicUniformReportsUniformsiv;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  basicUniformReportsUniform;
  TestLog *log;
  deUint32 programGL;
  Random *rnd_local;
  ShaderProgram *program_local;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
  *basicUniformReportsRef_local;
  vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  UniformInfoQueryCase *this_local;
  
  programGL_00 = glu::ShaderProgram::getProgram(program);
  log_00 = tcu::TestContext::getLog
                     ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
            *)&basicUniformReportsUniformsiv.
               super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
            *)local_78);
  if ((this->m_caseType == CASETYPE_UNIFORM) || (this->m_caseType == CASETYPE_CONSISTENCY)) {
    section.m_log._7_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"InfoGetActiveUniform",&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Uniform information queries with glGetActiveUniform()",&local_e1
              );
    tcu::ScopedLogSection::ScopedLogSection(&local_88,log_00,&local_a8,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    section.m_log._7_1_ =
         UniformCase::getActiveUniforms
                   (&this->super_UniformCase,
                    (vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                     *)&basicUniformReportsUniformsiv.
                        super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,basicUniformReportsRef,
                    programGL_00);
    tcu::ScopedLogSection::~ScopedLogSection(&local_88);
    if ((section.m_log._7_1_ & 1) == 0) {
      if (this->m_caseType == CASETYPE_UNIFORM) {
        this_local._7_1_ = false;
        goto LAB_01d83ff6;
      }
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_268,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_268,
                          (char (*) [66])
                          "// Note: this is a consistency case, so ignoring above failure(s)");
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_268);
    }
  }
  if ((this->m_caseType == CASETYPE_INDICES_UNIFORMSIV) ||
     (this->m_caseType == CASETYPE_CONSISTENCY)) {
    section_1.m_log._7_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"InfoGetActiveUniformsiv",&local_299);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,
               "Uniform information queries with glGetUniformIndices() and glGetActiveUniformsiv()",
               &local_2c1);
    tcu::ScopedLogSection::ScopedLogSection(&local_278,log_00,&local_298,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    section_1.m_log._7_1_ =
         UniformCase::getActiveUniformsiv
                   (&this->super_UniformCase,
                    (vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                     *)local_78,basicUniformReportsRef,programGL_00);
    tcu::ScopedLogSection::~ScopedLogSection(&local_278);
    if ((section_1.m_log._7_1_ & 1) == 0) {
      if (this->m_caseType == CASETYPE_INDICES_UNIFORMSIV) {
        this_local._7_1_ = false;
        goto LAB_01d83ff6;
      }
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_448,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_448,
                          (char (*) [66])
                          "// Note: this is a consistency case, so ignoring above failure(s)");
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_448);
    }
  }
  if (this->m_caseType == CASETYPE_CONSISTENCY) {
    section_2.m_log._7_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,"CompareUniformVsUniformsiv",&local_479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,
               "Comparison of results from glGetActiveUniform() and glGetActiveUniformsiv()",
               &local_4a1);
    tcu::ScopedLogSection::ScopedLogSection(&local_458,log_00,&local_478,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    section_2.m_log._7_1_ =
         UniformCase::uniformVsUniformsivComparison
                   (&this->super_UniformCase,
                    (vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                     *)&basicUniformReportsUniformsiv.
                        super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                     *)local_78);
    tcu::ScopedLogSection::~ScopedLogSection(&local_458);
    if ((section_2.m_log._7_1_ & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_01d83ff6;
    }
  }
  this_local._7_1_ = true;
LAB_01d83ff6:
  local_e8 = 1;
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::~vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
             *)local_78);
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::~vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
             *)&basicUniformReportsUniformsiv.
                super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

bool UniformInfoQueryCase::test (const vector<BasicUniform>& basicUniforms, const vector<BasicUniformReportRef>& basicUniformReportsRef, const ShaderProgram& program, Random& rnd)
{
	DE_UNREF(basicUniforms);
	DE_UNREF(rnd);

	const deUint32					programGL	= program.getProgram();
	TestLog&						log			= m_testCtx.getLog();
	vector<BasicUniformReportGL>	basicUniformReportsUniform;
	vector<BasicUniformReportGL>	basicUniformReportsUniformsiv;

	if (m_caseType == CASETYPE_UNIFORM || m_caseType == CASETYPE_CONSISTENCY)
	{
		bool success = false;

		{
			const ScopedLogSection section(log, "InfoGetActiveUniform", "Uniform information queries with glGetActiveUniform()");
			success = getActiveUniforms(basicUniformReportsUniform, basicUniformReportsRef, programGL);
		}

		if (!success)
		{
			if (m_caseType == CASETYPE_UNIFORM)
				return false;
			else
			{
				DE_ASSERT(m_caseType == CASETYPE_CONSISTENCY);
				log << TestLog::Message << "// Note: this is a consistency case, so ignoring above failure(s)" << TestLog::EndMessage;
			}
		}
	}

	if (m_caseType == CASETYPE_INDICES_UNIFORMSIV || m_caseType == CASETYPE_CONSISTENCY)
	{
		bool success = false;

		{
			const ScopedLogSection section(log, "InfoGetActiveUniformsiv", "Uniform information queries with glGetUniformIndices() and glGetActiveUniformsiv()");
			success = getActiveUniformsiv(basicUniformReportsUniformsiv, basicUniformReportsRef, programGL);
		}

		if (!success)
		{
			if (m_caseType == CASETYPE_INDICES_UNIFORMSIV)
				return false;
			else
			{
				DE_ASSERT(m_caseType == CASETYPE_CONSISTENCY);
				log << TestLog::Message << "// Note: this is a consistency case, so ignoring above failure(s)" << TestLog::EndMessage;
			}
		}
	}

	if (m_caseType == CASETYPE_CONSISTENCY)
	{
		bool success = false;

		{
			const ScopedLogSection section(log, "CompareUniformVsUniformsiv", "Comparison of results from glGetActiveUniform() and glGetActiveUniformsiv()");
			success = uniformVsUniformsivComparison(basicUniformReportsUniform, basicUniformReportsUniformsiv);
		}

		if (!success)
			return false;
	}

	return true;
}